

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O2

char * flatcc_json_parser_match_constant
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int pos,int *more)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  
  lVar3 = (long)pos;
  if (lVar3 < (long)end - (long)buf) {
    pcVar2 = buf + lVar3;
    cVar1 = *pcVar2;
    if (cVar1 == '\\') {
      *more = 0;
      if (ctx->error != 0) {
        return end;
      }
      ctx->error = 0x12;
      ctx->pos = ((int)pcVar2 - *(int *)&ctx->line_start) + 1;
      ctx->error_loc = pcVar2;
      return end;
    }
    if (cVar1 != '\"') {
      if (cVar1 != ' ') goto LAB_0011681f;
      pcVar2 = buf + lVar3;
      do {
        pcVar2 = pcVar2 + 1;
        if (pcVar2 == end) {
          *more = 0;
          return buf + ((long)end - (long)buf);
        }
      } while (*pcVar2 == ' ');
      if (*pcVar2 != '\"') {
        *more = 1;
        return pcVar2;
      }
    }
    buf = flatcc_json_parser_space(ctx,pcVar2 + 1,end);
    *more = 0;
  }
  else {
LAB_0011681f:
    *more = 0;
  }
  return buf;
}

Assistant:

const char *flatcc_json_parser_match_constant(flatcc_json_parser_t *ctx, const char *buf, const char *end, int pos, int *more)
{
    const char *mark = buf, *k = buf + pos;

    if (end - buf <= pos) {
        *more = 0;
        return buf;
    }
#if FLATCC_JSON_PARSE_ALLOW_UNQUOTED
    if (ctx->unquoted) {
        buf = flatcc_json_parser_space(ctx, k, end);
        if (buf == end) {
            /*
             * We cannot make a decision on more.
             * Just return end and let parser handle sync point in
             * case it is able to resume parse later on.
             * For the same reason we do not lower ctx->unquoted.
             */
            *more = 0;
            return buf;
        }
        if (buf != k) {
            char c = *buf;
            /*
             * Space was seen - and thus we have a valid match.
             * If the next char is an identifier start symbol
             * we raise the more flag to support syntax like:
             *
             *     `flags: Hungry Sleepy Awake, ...`
             */
            if (c == '_' || (c & 0x80)) {
                *more = 1;
                return buf;
            }
            c |= 0x20;
            if (c >= 'a' && c <= 'z') {
                *more = 1;
                return buf;
            }
        }
        /*
         * Space was not seen, so the match is only valid if followed
         * by a JSON separator symbol, and there cannot be more values
         * following so `more` is lowered.
         */
        *more = 0;
        if (*buf == ',' || *buf == '}' || *buf == ']') {
            return buf;
        }
        return mark;
    }
#endif
    buf = k;
    if (*buf == 0x20) {
        ++buf;
        while (buf != end && *buf == 0x20) {
            ++buf;
        }
        if (buf == end) {
            *more = 0;
            return buf;
        }
        /* We accept untrimmed space like "  Green  Blue  ". */
        if (*buf != '\"') {
            *more = 1;
            return buf;
        }
    }
    switch (*buf) {
    case '\\':
        *more = 0;
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_invalid_escape);
    case '\"':
        buf = flatcc_json_parser_space(ctx, buf + 1, end);
        *more = 0;
        return buf;
    }
    *more = 0;
    return mark;
}